

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O0

void __thiscall
nv::FloatImage::exponentiate(FloatImage *this,uint base_component,uint num,float power)

{
  ushort uVar1;
  ushort uVar2;
  float *pfVar3;
  double dVar4;
  uint local_34;
  uint i;
  float *ptr;
  uint c;
  uint size;
  float power_local;
  uint num_local;
  uint base_component_local;
  FloatImage *this_local;
  
  uVar1 = this->m_width;
  uVar2 = this->m_height;
  for (ptr._4_4_ = 0; ptr._4_4_ < num; ptr._4_4_ = ptr._4_4_ + 1) {
    pfVar3 = channel(this,base_component + ptr._4_4_);
    for (local_34 = 0; local_34 < (uint)uVar1 * (uint)uVar2; local_34 = local_34 + 1) {
      dVar4 = std::pow((double)(ulong)(uint)pfVar3[local_34],(double)(ulong)(uint)power);
      pfVar3[local_34] = SUB84(dVar4,0);
    }
  }
  return;
}

Assistant:

void FloatImage::exponentiate(uint base_component, uint num, float power)
{
	const uint size = m_width * m_height;

	for(uint c = 0; c < num; c++) {
		float * ptr = this->channel(base_component + c);
		
		for(uint i = 0; i < size; i++) {
			ptr[i] = pow(ptr[i], power);
		}
	}
}